

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<roundTripString_rtripconversions_Test>::CreateTest
          (ParameterizedTestFactory<roundTripString_rtripconversions_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::__cxx11::string>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_001c8e58;
  this_00[1]._vptr_Test = (_func_int **)&PTR__roundTripString_rtripconversions_Test_001c8e98;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }